

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O2

int Cudd_DumpDDcal(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  st__table *table;
  ulong uVar4;
  st__generator *gen;
  void *__ptr;
  DdNode *n_00;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong mask;
  int iVar8;
  ulong uVar9;
  DdNode *local_38;
  
  uVar2 = dd->size;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    table = (st__table *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    uVar4 = 0;
    if (0 < n) {
      uVar4 = (ulong)(uint)n;
    }
    uVar7 = 0;
LAB_00653f5b:
    if (uVar4 != uVar7) goto code_r0x00653f62;
    mask = (ulong)*f & 0xfffffffffffffffe;
    gen = st__init_gen(table);
    uVar7 = 0;
    while (iVar3 = st__gen(gen,(char **)&local_38,(char **)0x0), iVar3 != 0) {
      uVar7 = uVar7 | (ulong)local_38 ^ mask;
    }
    st__free_gen(gen);
    uVar5 = 0;
    do {
      if (0x3f < uVar5) break;
      mask = (ulong)(uint)~(-1 << ((byte)uVar5 & 0x1f));
      uVar5 = uVar5 + 4;
    } while (mask < uVar7);
    st__free_table(table);
    __ptr = malloc((long)(int)uVar2 * 4);
    if (__ptr == (void *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
LAB_00654139:
      __ptr = (void *)0x0;
LAB_0065413c:
      table = (st__table *)0x0;
      goto LAB_00654142;
    }
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined4 *)((long)__ptr + uVar7 * 4) = 0;
    }
    n_00 = Cudd_VectorSupport(dd,f,n);
    if (n_00 == (DdNode *)0x0) goto LAB_0065413c;
    piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    for (local_38 = n_00; (ulong)local_38->index != 0x7fffffff; local_38 = (local_38->type).kids.T)
    {
      *(undefined4 *)((long)__ptr + (ulong)local_38->index * 4) = 1;
    }
    Cudd_RecursiveDeref(dd,n_00);
    table = (st__table *)0x0;
    uVar7 = 0;
    while (uVar9 != uVar7) {
      if (*(int *)((long)__ptr + (long)dd->invperm[uVar7] * 4) != 0) {
        if ((inames == (char **)0x0) || (inames[dd->invperm[uVar7]] == (char *)0x0)) {
          iVar3 = fprintf((FILE *)fp,"v%d");
        }
        else {
          iVar3 = fprintf((FILE *)fp,"%s",inames[dd->invperm[uVar7]]);
        }
        if (iVar3 == -1) goto LAB_00654142;
      }
      pcVar6 = " * ";
      if (uVar2 - 1 == uVar7) {
        pcVar6 = "\n";
      }
      iVar3 = fprintf((FILE *)fp,"%s",pcVar6);
      uVar7 = uVar7 + 1;
      if (iVar3 == -1) goto LAB_00654142;
    }
    free(__ptr);
    table = st__init_table(st__ptrcmp,st__ptrhash);
    if (table == (st__table *)0x0) goto LAB_00654139;
    uVar7 = 0;
    while( true ) {
      if (uVar4 == uVar7) {
        iVar3 = fprintf((FILE *)fp,"[");
        __ptr = (void *)0x0;
        if (iVar3 == -1) break;
        uVar7 = 0;
        while (uVar4 != uVar7) {
          if (onames == (char **)0x0) {
            fprintf((FILE *)fp,"f%d",uVar7 & 0xffffffff);
          }
          else {
            fputs(onames[uVar7],(FILE *)fp);
          }
          pcVar6 = " ";
          if (n - 1 == uVar7) {
            pcVar6 = "";
          }
          iVar3 = fprintf((FILE *)fp,"%s",pcVar6);
          uVar7 = uVar7 + 1;
          __ptr = (void *)0x0;
          if (iVar3 == -1) goto LAB_00654142;
        }
        iVar3 = fprintf((FILE *)fp,"]\n");
        __ptr = (void *)0x0;
        if (iVar3 == -1) break;
        iVar3 = 1;
        goto LAB_0065414f;
      }
      iVar3 = ddDoDumpDDcal(dd,(DdNode *)((ulong)f[uVar7] & 0xfffffffffffffffe),fp,table,inames,mask
                           );
      __ptr = (void *)0x0;
      if (iVar3 == 0) break;
      if (onames == (char **)0x0) {
        iVar3 = fprintf((FILE *)fp,"f%d = ",uVar7 & 0xffffffff);
      }
      else {
        iVar3 = fprintf((FILE *)fp,"%s = ",onames[uVar7]);
      }
      if (iVar3 == -1) break;
      pcVar6 = "\'";
      if (((ulong)f[uVar7] & 1) == 0) {
        pcVar6 = "";
      }
      iVar3 = fprintf((FILE *)fp,"n%p%s\n",(mask & (ulong)f[uVar7]) / 0x28,pcVar6);
      uVar7 = uVar7 + 1;
      __ptr = (void *)0x0;
      if (iVar3 == -1) break;
    }
  }
LAB_00654142:
  iVar8 = 0;
  free(__ptr);
  iVar3 = 0;
  if (table != (st__table *)0x0) {
LAB_0065414f:
    iVar8 = iVar3;
    st__free_table(table);
  }
  return iVar8;
code_r0x00653f62:
  iVar3 = cuddCollectNodes((DdNode *)((ulong)f[uVar7] & 0xfffffffffffffffe),table);
  uVar7 = uVar7 + 1;
  if (iVar3 == 0) goto code_r0x00653f79;
  goto LAB_00653f5b;
code_r0x00653f79:
  __ptr = (void *)0x0;
  goto LAB_00654142;
}

Assistant:

int
Cudd_DumpDDcal(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    int           *sorted = NULL;
    int           nvars = dd->size;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);
    visited = NULL;

    /* Build a bit array with the support of f. */
    sorted = ABC_ALLOC(int,nvars);
    if (sorted == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        goto failure;
    }
    for (i = 0; i < nvars; i++) sorted[i] = 0;

    /* Take the union of the supports of each output function. */
    support = Cudd_VectorSupport(dd,f,n);
    if (support == NULL) goto failure;
    cuddRef(support);
    scan = support;
    while (!cuddIsConstant(scan)) {
        sorted[scan->index] = 1;
        scan = cuddT(scan);
    }
    Cudd_RecursiveDeref(dd,support);
    support = NULL; /* so that we do not try to free it in case of failure */
    for (i = 0; i < nvars; i++) {
        if (sorted[dd->invperm[i]]) {
            if (inames == NULL || inames[dd->invperm[i]] == NULL) {
                retval = fprintf(fp,"v%d", dd->invperm[i]);
            } else {
                retval = fprintf(fp,"%s", inames[dd->invperm[i]]);
            }
            if (retval == EOF) goto failure;
        }
        retval = fprintf(fp,"%s", i == nvars - 1 ? "\n" : " * ");
        if (retval == EOF) goto failure;
    }
    ABC_FREE(sorted);
    sorted = NULL;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        retval = ddDoDumpDDcal(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "n%p%s\n",
                         (void *) (((ptruint) f[i] & mask) /
                         (ptruint) sizeof(DdNode)),
                         Cudd_IsComplement(f[i]) ? "'" : "");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d", i);
        } else {
            retval = fprintf(fp, "%s", onames[i]);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : " ");
        if (retval == EOF) goto failure;
    }
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    if ( visited )
        st__free_table(visited);
    return(1);

failure:
    if (sorted != NULL) ABC_FREE(sorted);
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}